

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

int __thiscall Fl_Input_::handletext(Fl_Input_ *this,int event,int X,int Y,int W,int H)

{
  int Y_00;
  int W_00;
  int H_00;
  bool bVar1;
  int iVar2;
  Fl_Window *pFVar3;
  int iVar4;
  byte *text;
  int iVar5;
  undefined4 in_register_00000014;
  Fl_Cursor c;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  int local_34;
  
  text = (byte *)Fl::e_text;
  iVar2 = 0;
  if (0x10 < event - 1U) {
    return 0;
  }
  iVar4 = (&switchD_001bc7ee::switchdataD_0021c290)[event - 1U] + 0x21c290;
  switch(event) {
  case 1:
    iVar2 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar2 != 0) &&
       (pFVar3 = Fl_Widget::window(&this->super_Fl_Widget), pFVar3 != (Fl_Window *)0x0)) {
      pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar3,FL_CURSOR_INSERT);
    }
    handle_mouse(this,X,Y,iVar4,W,Fl::e_state & 0x10000);
    iVar2 = 1;
    if ((Fl_Input_ *)Fl::focus_ != this) {
      Fl::focus(&this->super_Fl_Widget);
      (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    }
    break;
  case 2:
    copy(this,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)CONCAT44(in_register_00000014,X));
    goto LAB_001bcb9e;
  case 3:
  case 0xb:
    iVar2 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar2 == 0) {
      return 1;
    }
    pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar3 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_INSERT;
    goto LAB_001bcaeb;
  case 4:
    iVar2 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if (iVar2 == 0) {
      return 1;
    }
    pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
    if (pFVar3 == (Fl_Window *)0x0) {
      return 1;
    }
    pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
    c = FL_CURSOR_DEFAULT;
LAB_001bcaeb:
    iVar2 = 1;
    Fl_Window::cursor(pFVar3,c);
    break;
  case 5:
    iVar2 = 1;
    handle_mouse(this,X,Y,iVar4,W,1);
    break;
  case 6:
    iVar2 = this->textfont_;
    iVar4 = this->textsize_;
    iVar5 = (this->super_Fl_Widget).x_;
    Y_00 = (this->super_Fl_Widget).y_;
    W_00 = (this->super_Fl_Widget).w_;
    H_00 = (this->super_Fl_Widget).h_;
    pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(iVar2,iVar4,iVar5,Y_00,W_00,H_00,pFVar3);
    iVar2 = this->position_;
    iVar4 = this->mark_;
    if (iVar4 == iVar2) {
      iVar4 = this->size_ + 1;
    }
    else if (iVar2 < iVar4) {
      iVar4 = iVar2;
    }
    minimal_update(this,iVar4);
    goto LAB_001bcb9e;
  case 7:
    iVar2 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar2 != 0) &&
       (pFVar3 = Fl_Widget::window(&this->super_Fl_Widget), pFVar3 != (Fl_Window *)0x0)) {
      pFVar3 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar3,FL_CURSOR_DEFAULT);
    }
    iVar2 = this->position_;
    iVar4 = this->mark_;
    if (iVar4 == iVar2) {
      if (((this->super_Fl_Widget).damage_ & 2) == 0) {
        minimal_update(this,iVar2);
        this->erase_cursor_only = '\x01';
      }
    }
    else {
      if (iVar2 < iVar4) {
        iVar4 = iVar2;
      }
      minimal_update(this,iVar4);
    }
  case 0xf:
    fl_reset_spot();
    iVar2 = 1;
    if ((((this->super_Fl_Widget).type_ & 8) == 0) && (((this->super_Fl_Widget).when_ & 4) != 0)) {
      maybe_do_callback(this);
    }
    break;
  case 0xc:
    if (this->shortcut_ == 0) {
      iVar2 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      iVar2 = Fl::test_shortcut(this->shortcut_);
    }
    if (iVar2 == 0) {
      return 0;
    }
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (!bVar1) {
      return 0;
    }
    iVar2 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    if (iVar2 == 0) {
      return 0;
    }
    Fl::focus(&this->super_Fl_Widget);
    goto LAB_001bcb9e;
  case 0x11:
    bVar10 = (this->super_Fl_Widget).type_;
    if ((bVar10 & 8) == 0) {
      if (Fl::e_text == (char *)0x0) {
        return 1;
      }
      if ((long)Fl::e_length == 0) {
        return 1;
      }
      pbVar6 = (byte *)(Fl::e_text + Fl::e_length);
      bVar10 = bVar10 & 7;
      pbVar9 = pbVar6;
      if (bVar10 != 4) {
        do {
          pbVar6 = pbVar9;
          if (pbVar6 <= text) break;
          iVar2 = isspace((uint)pbVar6[-1]);
          pbVar9 = pbVar6 + -1;
        } while (iVar2 != 0);
      }
      if (pbVar6 <= text) {
        return 1;
      }
      local_34 = (int)pbVar6;
      iVar2 = (int)text;
      if (bVar10 == 2) {
        local_34 = (local_34 - iVar2) + 1;
        pbVar9 = text;
        do {
          text = pbVar9;
          bVar10 = *text;
          iVar2 = isspace((uint)bVar10);
          pbVar9 = text + 1;
          local_34 = local_34 + -1;
          if (pbVar6 <= text) break;
        } while (iVar2 != 0);
        if ((bVar10 != 0x2b) && (bVar10 != 0x2d)) {
          pbVar9 = text;
        }
        iVar2 = strncmp((char *)pbVar9,"0x",2);
        if (iVar2 == 0) {
          pbVar9 = pbVar9 + 2;
          do {
            iVar2 = isxdigit((uint)*pbVar9);
            pbVar7 = pbVar9 + 1;
            if (pbVar6 <= pbVar9) break;
            pbVar9 = pbVar7;
          } while (iVar2 != 0);
        }
        else {
          do {
            pbVar7 = pbVar9 + 1;
            if (pbVar6 <= pbVar9) break;
            bVar10 = *pbVar9;
            pbVar9 = pbVar7;
          } while (bVar10 - 0x30 < 10);
        }
        if (pbVar7 + -1 < pbVar6) {
LAB_001bcc86:
          fl_beep(2);
          return 1;
        }
        iVar5 = this->size_;
        iVar4 = 0;
      }
      else if (bVar10 == 1) {
        local_34 = (local_34 - iVar2) + 1;
        pbVar9 = text;
        do {
          text = pbVar9;
          bVar10 = *text;
          iVar2 = isspace((uint)bVar10);
          pbVar9 = text + 1;
          local_34 = local_34 + -1;
          if (pbVar6 <= text) break;
        } while (iVar2 != 0);
        if ((bVar10 != 0x2b) && (bVar10 != 0x2d)) {
          pbVar9 = text;
        }
        do {
          bVar10 = *pbVar9;
          pbVar7 = pbVar9 + 1;
          if (pbVar6 <= pbVar9) break;
          pbVar9 = pbVar7;
        } while (bVar10 - 0x30 < 10);
        if (bVar10 == 0x2e) {
          do {
            pbVar9 = pbVar7;
            pbVar7 = pbVar9 + 1;
            if (pbVar6 <= pbVar9) break;
          } while (*pbVar9 - 0x30 < 10);
          if ((*pbVar9 | 0x20) == 0x65) {
            if ((*pbVar7 == 0x2b) || (pbVar8 = pbVar7, *pbVar7 == 0x2d)) {
              pbVar8 = pbVar9 + 2;
            }
            do {
              pbVar7 = pbVar8 + 1;
              if (pbVar6 <= pbVar8) break;
              bVar10 = *pbVar8;
              pbVar8 = pbVar7;
            } while (bVar10 - 0x30 < 10);
          }
        }
        if (pbVar7 + -1 < pbVar6) goto LAB_001bcc86;
        iVar5 = this->size_;
        iVar4 = 0;
      }
      else {
        iVar4 = this->position_;
        iVar5 = this->mark_;
        local_34 = local_34 - iVar2;
      }
      iVar2 = replace(this,iVar4,iVar5,(char *)text,local_34);
      return iVar2;
    }
    fl_beep(2);
LAB_001bcb9e:
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Fl_Input_::handletext(int event, int X, int Y, int W, int H) {
  switch (event) {

  case FL_ENTER:
  case FL_MOVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);
    return 1;

  case FL_LEAVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    return 1;

  case FL_FOCUS:
    fl_set_spot(textfont(), textsize(), x(), y(), w(), h(), window());
    if (mark_ == position_) {
      minimal_update(size()+1);
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
    return 1;

  case FL_UNFOCUS:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    if (mark_ == position_) {
      if (!(damage()&FL_DAMAGE_EXPOSE)) {minimal_update(position_); erase_cursor_only = 1;}
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
  case FL_HIDE:
    fl_reset_spot();
    if (!readonly() && (when() & FL_WHEN_RELEASE))
      maybe_do_callback();
    return 1;

  case FL_PUSH:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);

    handle_mouse(X, Y, W, H, Fl::event_state(FL_SHIFT));

    if (Fl::focus() != this) {
      Fl::focus(this);
      handle(FL_FOCUS);
    }
    return 1;

  case FL_DRAG:
    handle_mouse(X, Y, W, H, 1);
    return 1;

  case FL_RELEASE:
    copy(0);
    return 1;

  case FL_PASTE: {
    // Don't allow pastes into readonly widgets...
    if (readonly()) {
      fl_beep(FL_BEEP_ERROR);
      return 1;
    }

    // See if we have anything to paste...
    if (!Fl::event_text() || !Fl::event_length()) return 1;

    // strip trailing control characters and spaces before pasting:
    const char* t = Fl::event_text();
    const char* e = t+Fl::event_length();
    if (input_type() != FL_MULTILINE_INPUT) while (e > t && isspace(*(e-1) & 255)) e--;
    if (!t || e <= t) return 1; // Int/float stuff will crash without this test
    if (input_type() == FL_INT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      if (strncmp(p, "0x", 2) == 0) {
        p += 2;
        while (isxdigit(*p & 255) && p < e) p ++;
      } else {
        while (isdigit(*p & 255) && p < e) p ++;
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    } else if (input_type() == FL_FLOAT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      while (isdigit(*p & 255) && p < e) p ++;
      if (*p == '.') {
        p ++;
        while (isdigit(*p & 255) && p < e) p ++;
	if (*p == 'e' || *p == 'E') {
	  p ++;
	  if (*p == '+' || *p == '-') p ++;
	  while (isdigit(*p & 255) && p < e) p ++;
	}
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    }
    return replace(position(), mark(), t, (int) (e-t));}

  case FL_SHORTCUT:
    if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut())) 
      return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) {
      Fl::focus(this);
      return 1;
    } // else fall through

  default:
    return 0;
  }
}